

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

string * toBinary_abi_cxx11_(string *__return_storage_ptr__,int num,int bits)

{
  vector<char,_std::allocator<char>_> digits;
  pointer local_50;
  vector<char,_std::allocator<char>_> local_48;
  pointer local_30;
  
  std::vector<char,_std::allocator<char>_>::vector(&local_48,(long)bits,(allocator_type *)&local_50)
  ;
  if (0 < bits) {
    do {
      local_50 = (pointer)CONCAT71(local_50._1_7_,
                                   ((char)num - ((char)num - (char)(num >> 0x1f) & 0xfeU)) + '0');
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_48,(char *)&local_50);
      num = num >> 1;
      bits = bits + -1;
    } while (bits != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_50 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_30 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::__cxx11::string::
  _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>>
            ((string *)__return_storage_ptr__);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toBinary(int num, int bits) {
    std::vector<char> digits(bits);
    for (int i = 0; i < bits; ++i) {
        digits.push_back(num % 2 + '0');
        num >>= 1;
    }
    return std::string(digits.rbegin(), digits.rend());
}